

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_nlm.hpp
# Opt level: O2

pair<const_int_*,_unsigned_long> __thiscall
poplar::compact_bonsai_nlm<int,_16UL>::compare
          (compact_bonsai_nlm<int,_16UL> *this,uint64_t pos,char_range *key)

{
  unsigned_long uVar1;
  uint8_t *puVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int *piVar5;
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> codes;
  unsigned_long uVar6;
  bool bVar7;
  pair<const_int_*,_unsigned_long> pVar8;
  uint64_t alloc;
  uint64_t local_28;
  
  codes._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (this->ptrs_).
       super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[pos >> 4]._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t;
  uVar3 = bit_tools::popcnt((this->chunks_).
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start[pos >> 4],
                            (ulong)((uint)pos & 0xf));
  local_28 = 0;
  while( true ) {
    uVar4 = vbyte::decode((uint8_t *)
                          codes._M_t.
                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,&local_28);
    piVar5 = (int *)((long)codes._M_t.
                           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                           .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar4);
    bVar7 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar7) break;
    codes._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)((long)piVar5 + local_28);
  }
  puVar2 = key->begin;
  if (puVar2 == key->end) {
    uVar6 = 0;
  }
  else {
    uVar1 = local_28 - 4;
    for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
      if (puVar2[uVar6] !=
          *(uint8_t *)
           ((long)codes._M_t.
                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar6 + uVar4)) {
        piVar5 = (int *)0x0;
        goto LAB_00116cb3;
      }
    }
    if (puVar2[uVar1] == '\0') {
      uVar6 = local_28 - 3;
      piVar5 = (int *)((long)piVar5 + uVar1);
    }
    else {
      piVar5 = (int *)0x0;
      uVar6 = uVar1;
    }
  }
LAB_00116cb3:
  pVar8.second = uVar6;
  pVar8.first = piVar5;
  return pVar8;
}

Assistant:

std::pair<const value_type*, uint64_t> compare(uint64_t pos, const char_range& key) const {
        auto [chunk_id, pos_in_chunk] = decompose_value<ChunkSize>(pos);

        assert(ptrs_[chunk_id]);
        assert(bit_tools::get_bit(chunks_[chunk_id], pos_in_chunk));

        const uint8_t* ptr = ptrs_[chunk_id].get();
        const uint64_t offset = bit_tools::popcnt(chunks_[chunk_id], pos_in_chunk);

        uint64_t alloc = 0;
        for (uint64_t i = 0; i < offset; ++i) {
            ptr += vbyte::decode(ptr, alloc);
            ptr += alloc;
        }
        ptr += vbyte::decode(ptr, alloc);

        if (key.empty()) {
            return {reinterpret_cast<const value_type*>(ptr), 0};
        }

        uint64_t length = alloc - sizeof(value_type);
        for (uint64_t i = 0; i < length; ++i) {
            if (key[i] != ptr[i]) {
                return {nullptr, i};
            }
        }

        if (key[length] != '\0') {
            return {nullptr, length};
        }

        // +1 considers the terminator '\0'
        return {reinterpret_cast<const value_type*>(ptr + length), length + 1};
    }